

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

MainFunc __thiscall capnp::compiler::CompilerMain::getDecodeMain(CompilerMain *this)

{
  StringPtr extendedDescription;
  MainBuilder *pMVar1;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  MainFunc MVar2;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  initializer_list<kj::MainBuilder::OptionName> names_01;
  initializer_list<kj::MainBuilder::OptionName> names_02;
  StringPtr title;
  StringPtr title_00;
  StringPtr version;
  StringPtr briefDescription;
  StringPtr helpText;
  StringPtr helpText_00;
  StringPtr helpText_01;
  StringPtr helpText_02;
  MainBuilder builder;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> local_158;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface> local_148;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface> local_138;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> local_128;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> local_118;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> local_108;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> local_f8;
  OptionName local_e8;
  OptionName local_d8;
  OptionName local_c8;
  char *local_b8;
  undefined8 uStack_b0;
  OptionName local_a8;
  undefined1 local_98;
  char *local_90;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:197:30),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:197:30)>
  local_88;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:196:33),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:196:33)>
  local_78;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:195:40),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:195:40)>
  local_68;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:191:34),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:191:34)>
  local_58;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:188:34),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:188:34)>
  local_48;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:182:40),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:182:40)>
  local_38;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:179:33),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:179:33)>
  local_28;
  
  in_RSI->annotationFlag = DROP_ANNOTATIONS;
  in_RSI->compileEagerness = 1;
  local_b8 = "";
  uStack_b0 = 1;
  extendedDescription.content.size_ = 1;
  extendedDescription.content.ptr = "";
  version.content.size_ = 0x1e;
  version.content.ptr = "Cap\'n Proto version (unknown)";
  briefDescription.content.size_ = 0xef;
  briefDescription.content.ptr =
       "Decodes one or more encoded Cap\'n Proto messages as text.  The messages have root type <type> defined in <schema-file>.  Messages are read from standard input and by default are expected to be in standard Cap\'n Proto serialization format."
  ;
  kj::MainBuilder::MainBuilder
            (&builder,in_RSI->context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,&builder);
  local_c8.isLong = true;
  local_c8.field_1.longName = "flat";
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_f8,&local_28);
  names._M_len = 1;
  names._M_array = &local_c8;
  helpText.content.size_ = 0x7f;
  helpText.content.ptr =
       "Interpret the input as one large single-segment message rather than a stream in standard serialization format.  (Rarely used.)"
  ;
  pMVar1 = kj::MainBuilder::addOption
                     (&builder,names,(Function<kj::MainBuilder::Validity_()> *)&local_f8,helpText);
  local_a8.isLong = false;
  local_a8.field_1.shortName = 'p';
  local_98 = 1;
  local_90 = "packed";
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_108,&local_38);
  names_00._M_len = 2;
  names_00._M_array = &local_a8;
  helpText_00.content.size_ = 0x122;
  helpText_00.content.ptr =
       "Expect the input to be packed using standard Cap\'n Proto packing, which deflates zero-valued bytes.  (This reads messages written with capnp::writePackedMessage*() from <capnp/serialize-packed.h>.  Do not use this for messages written with capnp::writeMessage*() from <capnp/serialize.h>.)"
  ;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_00,(Function<kj::MainBuilder::Validity_()> *)&local_108,
                      helpText_00);
  local_d8.isLong = true;
  local_d8.field_1.longName = "short";
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_6_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_118,&local_48);
  names_01._M_len = 1;
  names_01._M_array = &local_d8;
  helpText_01.content.size_ = 0x80;
  helpText_01.content.ptr =
       "Print in short (non-pretty) format.  Each message will be printed on one line, without using whitespace to improve readability."
  ;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_01,(Function<kj::MainBuilder::Validity_()> *)&local_118,
                      helpText_01);
  local_e8.isLong = true;
  local_e8.field_1.longName = "quiet";
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_8_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_128,&local_58);
  names_02._M_len = 1;
  names_02._M_array = &local_e8;
  helpText_02.content.size_ = 0xa5;
  helpText_02.content.ptr =
       "Do not print warning messages about the input being in the wrong format.  Use this if you find the warnings are wrong (but also let us know so we can improve them)."
  ;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_02,(Function<kj::MainBuilder::Validity_()> *)&local_128,
                      helpText_02);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_10_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_138,&local_68);
  title.content.size_ = 0xe;
  title.content.ptr = "<schema-file>";
  pMVar1 = kj::MainBuilder::expectArg
                     (pMVar1,title,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_138
                     );
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_12_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_148,&local_78);
  title_00.content.size_ = 7;
  title_00.content.ptr = "<type>";
  pMVar1 = kj::MainBuilder::expectArg
                     (pMVar1,title_00,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_148);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_13_,capnp::compiler::CompilerMain::getDecodeMain()::_lambda(auto:1&,(auto:2&&)___)_14_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_158,&local_88);
  kj::MainBuilder::callAfterParsing(pMVar1,(Function<kj::MainBuilder::Validity_()> *)&local_158);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface>::dispose(&local_158);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface>::dispose(&local_148);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface>::dispose(&local_138);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface>::dispose(&local_128);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface>::dispose(&local_118);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface>::dispose(&local_108);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface>::dispose(&local_f8);
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder(&builder);
  MVar2.impl.ptr = extraout_RDX;
  MVar2.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar2.impl;
}

Assistant:

kj::MainFunc getDecodeMain() {
    // Only parse the schemas we actually need for decoding.
    compileEagerness = Compiler::NODE;

    // Drop annotations since we don't need them.  This avoids importing files like c++.capnp.
    annotationFlag = Compiler::DROP_ANNOTATIONS;

    kj::MainBuilder builder(context, VERSION_STRING,
          "Decodes one or more encoded Cap'n Proto messages as text.  The messages have root "
          "type <type> defined in <schema-file>.  Messages are read from standard input and "
          "by default are expected to be in standard Cap'n Proto serialization format.");
    addGlobalOptions(builder);
    builder.addOption({"flat"}, KJ_BIND_METHOD(*this, codeFlat),
                      "Interpret the input as one large single-segment message rather than a "
                      "stream in standard serialization format.  (Rarely used.)")
           .addOption({'p', "packed"}, KJ_BIND_METHOD(*this, codePacked),
                      "Expect the input to be packed using standard Cap'n Proto packing, which "
                      "deflates zero-valued bytes.  (This reads messages written with "
                      "capnp::writePackedMessage*() from <capnp/serialize-packed.h>.  Do not use "
                      "this for messages written with capnp::writeMessage*() from "
                      "<capnp/serialize.h>.)")
           .addOption({"short"}, KJ_BIND_METHOD(*this, printShort),
                      "Print in short (non-pretty) format.  Each message will be printed on one "
                      "line, without using whitespace to improve readability.")
           .addOption({"quiet"}, KJ_BIND_METHOD(*this, setQuiet),
                      "Do not print warning messages about the input being in the wrong format.  "
                      "Use this if you find the warnings are wrong (but also let us know so "
                      "we can improve them).")
           .expectArg("<schema-file>", KJ_BIND_METHOD(*this, addSource))
           .expectArg("<type>", KJ_BIND_METHOD(*this, setRootType))
           .callAfterParsing(KJ_BIND_METHOD(*this, decode));
    return builder.build();
  }